

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O3

void __thiscall
ncnn::Mat::to_pixels_resize
          (Mat *this,uchar *pixels,int type,int target_width,int target_height,int target_stride)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  uchar *puVar5;
  int *piVar6;
  void *local_88;
  int *local_40;
  void *ptr;
  
  iVar1 = this->w;
  iVar2 = this->h;
  if (iVar2 == target_height && iVar1 == target_width) {
    to_pixels(this,pixels,type);
    return;
  }
  uVar3 = type >> 0x10;
  if ((uint)type < 0x10000) {
    uVar3 = type;
  }
  if (uVar3 - 1 < 2) {
    local_88 = (void *)0x0;
    if (iVar2 * iVar1 == 0) {
      piVar6 = (int *)0x0;
      puVar5 = (uchar *)0x0;
    }
    else {
      uVar4 = (long)(iVar2 * iVar1) * 3 + 3U & 0xfffffffffffffffc;
      ptr = (void *)0x0;
      iVar1 = posix_memalign(&ptr,0x10,uVar4 + 4);
      local_88 = (void *)0x0;
      if (iVar1 == 0) {
        local_88 = ptr;
      }
      piVar6 = (int *)(uVar4 + (long)local_88);
      *(undefined4 *)((long)local_88 + uVar4) = 1;
      puVar5 = (uchar *)ptr;
    }
    to_pixels(this,puVar5,type);
    resize_bilinear_c3(puVar5,this->w,this->h,this->w * 3,pixels,target_width,target_height,
                       target_stride);
    if (piVar6 == (int *)0x0) {
      return;
    }
    LOCK();
    *piVar6 = *piVar6 + -1;
    iVar1 = *piVar6;
    UNLOCK();
  }
  else if (uVar3 == 3) {
    local_88 = (void *)0x0;
    if (iVar2 * iVar1 == 0) {
      local_40 = (int *)0x0;
      puVar5 = (uchar *)0x0;
    }
    else {
      uVar4 = (long)(iVar2 * iVar1) + 3U & 0xfffffffffffffffc;
      ptr = (void *)0x0;
      iVar1 = posix_memalign(&ptr,0x10,uVar4 + 4);
      local_88 = (void *)0x0;
      if (iVar1 == 0) {
        local_88 = ptr;
      }
      local_40 = (int *)((long)local_88 + uVar4);
      *(undefined4 *)((long)local_88 + uVar4) = 1;
      puVar5 = (uchar *)ptr;
    }
    to_pixels(this,puVar5,type);
    resize_bilinear_c1(puVar5,this->w,this->h,this->w,pixels,target_width,target_height,
                       target_stride);
    if (local_40 == (int *)0x0) {
      return;
    }
    LOCK();
    *local_40 = *local_40 + -1;
    iVar1 = *local_40;
    UNLOCK();
  }
  else {
    if ((uVar3 & 0xfffffffe) != 4) {
      return;
    }
    local_88 = (void *)0x0;
    iVar2 = iVar2 * iVar1;
    if (iVar2 == 0) {
      piVar6 = (int *)0x0;
      puVar5 = (uchar *)0x0;
    }
    else {
      ptr = (void *)0x0;
      iVar1 = posix_memalign(&ptr,0x10,(long)iVar2 * 4 + 4);
      local_88 = (void *)0x0;
      if (iVar1 == 0) {
        local_88 = ptr;
      }
      piVar6 = (int *)((long)local_88 + (long)iVar2 * 4);
      *piVar6 = 1;
      puVar5 = (uchar *)ptr;
    }
    to_pixels(this,puVar5,type);
    resize_bilinear_c4(puVar5,this->w,this->h,this->w * 4,pixels,target_width,target_height,
                       target_stride);
    if (piVar6 == (int *)0x0) {
      return;
    }
    LOCK();
    *piVar6 = *piVar6 + -1;
    iVar1 = *piVar6;
    UNLOCK();
  }
  if ((iVar1 == 0) && (local_88 != (void *)0x0)) {
    free(local_88);
  }
  return;
}

Assistant:

void Mat::to_pixels_resize(unsigned char* pixels, int type, int target_width, int target_height, int target_stride) const
{
    if (w == target_width && h == target_height)
        return to_pixels(pixels, type);

    int type_to = (type & PIXEL_CONVERT_MASK) ? (type >> PIXEL_CONVERT_SHIFT) : (type & PIXEL_FORMAT_MASK);

    if (type_to == PIXEL_RGB || type_to == PIXEL_BGR)
    {
        Mat src(w, h, (size_t)3u, 3);

        to_pixels(src, type);

        resize_bilinear_c3(src, w, h, w * 3, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_GRAY)
    {
        Mat src(w, h, (size_t)1u, 1);

        to_pixels(src, type);

        resize_bilinear_c1(src, w, h, w * 1, pixels, target_width, target_height, target_stride);
    }
    else if (type_to == PIXEL_RGBA || type_to == PIXEL_BGRA)
    {
        Mat src(w, h, (size_t)4u, 4);

        to_pixels(src, type);

        resize_bilinear_c4(src, w, h, w * 4, pixels, target_width, target_height, target_stride);
    }
}